

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O3

bool __thiscall
cmsys::SystemInformationImplementation::QueryLinuxMemory(SystemInformationImplementation *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  size_t sVar6;
  FILE *__stream;
  int i;
  long lVar7;
  uint uVar8;
  unsigned_long cachedMem;
  unsigned_long ap;
  unsigned_long av;
  unsigned_long tp;
  unsigned_long tv;
  unsigned_long buffersMem;
  unsigned_long temp;
  long local_5f0;
  long local_5e8;
  long local_5e0;
  ulong local_5d8;
  ulong uStack_5d0;
  utsname unameInfo;
  char buffer [1024];
  
  uVar8 = 0;
  tv = 0;
  tp = 0;
  av = 0;
  ap = 0;
  iVar2 = uname((utsname *)&unameInfo);
  if (iVar2 == 0) {
    sVar6 = strlen(unameInfo.release);
    bVar1 = false;
    if (2 < sVar6) {
      uVar8 = 0;
      if ((int)unameInfo.release[0] - 0x30U < 10) {
        uVar8 = (int)unameInfo.release[0] - 0x30U;
      }
      bVar1 = '5' < unameInfo.release[2] && (int)unameInfo.release[2] - 0x30U < 10;
    }
    __stream = fopen64("/proc/meminfo","r");
    if (__stream != (FILE *)0x0) {
      if ((2 < (int)uVar8) || ((bool)(uVar8 == 2 & bVar1))) {
        cachedMem._4_2_ = 0;
        cachedMem._0_4_ = 0;
        pcVar5 = fgets(buffer,0x400,__stream);
        if (pcVar5 != (char *)0x0) {
          lVar7 = 0;
          iVar2 = 0;
          do {
            do {
              if ((*(char *)((long)&cachedMem + lVar7) == '\0') &&
                 (iVar3 = __isoc99_sscanf(buffer,(long)&DAT_0051b2fc +
                                                 (long)(int)(&DAT_0051b2fc)[lVar7],&temp + lVar7),
                 iVar3 == 1)) {
                *(undefined1 *)((long)&cachedMem + lVar7) = 1;
                iVar2 = iVar2 + 1;
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 != 6);
            pcVar5 = fgets(buffer,0x400,__stream);
            lVar7 = 0;
          } while (pcVar5 != (char *)0x0);
          if (iVar2 == 6) {
            this->TotalPhysicalMemory = temp >> 10;
            this->AvailablePhysicalMemory = (ulong)(local_5e8 + local_5f0 + local_5e0) >> 10;
            this->TotalVirtualMemory = local_5d8 >> 10;
            this->AvailableVirtualMemory = uStack_5d0 >> 10;
            goto LAB_0043c63a;
          }
        }
      }
      else {
        pcVar5 = fgets(buffer,0x400,__stream);
        if (pcVar5 == buffer) {
          iVar2 = __isoc99_fscanf(__stream,"Mem: %lu %lu %lu %lu %lu %lu\n",&tp,&temp,&ap,&temp,
                                  &buffersMem,&cachedMem);
          if (iVar2 == 6) {
            iVar2 = __isoc99_fscanf(__stream,"Swap: %lu %lu %lu\n",&tv,&temp,&av);
            iVar2 = iVar2 + 6;
          }
          if (iVar2 == 9) {
            this->TotalVirtualMemory = tv >> 0x14;
            this->TotalPhysicalMemory = tp >> 0x14;
            this->AvailableVirtualMemory = av >> 0x14;
            this->AvailablePhysicalMemory =
                 buffersMem + ap +
                 CONCAT26(cachedMem._6_2_,CONCAT24(cachedMem._4_2_,(undefined4)cachedMem)) >> 0x14;
LAB_0043c63a:
            fclose(__stream);
            return true;
          }
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Problem parsing /proc/meminfo",0x1d);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
      std::ostream::put('@');
      std::ostream::flush();
      fclose(__stream);
      return false;
    }
    pcVar5 = "Problem opening /proc/meminfo";
    sVar6 = 0x1d;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Problem calling uname(): ",0x19);
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x607740);
      goto LAB_0043c52c;
    }
    sVar6 = strlen(pcVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar6);
LAB_0043c52c:
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  return false;
}

Assistant:

bool SystemInformationImplementation::QueryLinuxMemory()
{
#if defined(__linux)
  unsigned long tv=0;
  unsigned long tp=0;
  unsigned long av=0;
  unsigned long ap=0;

  char buffer[1024]; // for reading lines

  int linuxMajor = 0;
  int linuxMinor = 0;

  // Find the Linux kernel version first
  struct utsname unameInfo;
  int errorFlag = uname(&unameInfo);
  if( errorFlag!=0 )
    {
    kwsys_ios::cout << "Problem calling uname(): " << strerror(errno) << kwsys_ios::endl;
    return false;
    }

  if( strlen(unameInfo.release)>=3 )
    {
    // release looks like "2.6.3-15mdk-i686-up-4GB"
    char majorChar=unameInfo.release[0];
    char minorChar=unameInfo.release[2];

    if( isdigit(majorChar) )
      {
      linuxMajor=majorChar-'0';
      }

    if( isdigit(minorChar) )
      {
      linuxMinor=minorChar-'0';
      }
    }

  FILE *fd = fopen("/proc/meminfo", "r" );
  if ( !fd )
    {
    kwsys_ios::cout << "Problem opening /proc/meminfo" << kwsys_ios::endl;
    return false;
    }

  if( linuxMajor>=3 || ( (linuxMajor>=2) && (linuxMinor>=6) ) )
    {
    // new /proc/meminfo format since kernel 2.6.x
    // Rigorously, this test should check from the developping version 2.5.x
    // that introduced the new format...

    enum { mMemTotal, mMemFree, mBuffers, mCached, mSwapTotal, mSwapFree };
    const char* format[6] =
      { "MemTotal:%lu kB", "MemFree:%lu kB", "Buffers:%lu kB",
        "Cached:%lu kB", "SwapTotal:%lu kB", "SwapFree:%lu kB" };
    bool have[6] = { false, false, false, false, false, false };
    unsigned long value[6];
    int count = 0;
    while(fgets(buffer, static_cast<int>(sizeof(buffer)), fd))
      {
      for(int i=0; i < 6; ++i)
        {
        if(!have[i] && sscanf(buffer, format[i], &value[i]) == 1)
          {
          have[i] = true;
          ++count;
          }
        }
      }
    if(count == 6)
      {
      this->TotalPhysicalMemory = value[mMemTotal] / 1024;
      this->AvailablePhysicalMemory =
        (value[mMemFree] + value[mBuffers] + value[mCached]) / 1024;
      this->TotalVirtualMemory = value[mSwapTotal] / 1024;
      this->AvailableVirtualMemory = value[mSwapFree] / 1024;
      }
    else
      {
      kwsys_ios::cout << "Problem parsing /proc/meminfo" << kwsys_ios::endl;
      fclose(fd);
      return false;
      }
    }
  else
    {
    // /proc/meminfo format for kernel older than 2.6.x

    unsigned long temp;
    unsigned long cachedMem;
    unsigned long buffersMem;
    // Skip "total: used:..."
    char *r=fgets(buffer, static_cast<int>(sizeof(buffer)), fd);
    int status=0;
    if(r==buffer)
      {
      status+=fscanf(fd, "Mem: %lu %lu %lu %lu %lu %lu\n",
                     &tp, &temp, &ap, &temp, &buffersMem, &cachedMem);
      }
    if(status==6)
      {
      status+=fscanf(fd, "Swap: %lu %lu %lu\n", &tv, &temp, &av);
      }
    if(status==9)
      {
      this->TotalVirtualMemory = tv>>10>>10;
      this->TotalPhysicalMemory = tp>>10>>10;
      this->AvailableVirtualMemory = av>>10>>10;
      this->AvailablePhysicalMemory = (ap+buffersMem+cachedMem)>>10>>10;
      }
    else
      {
      kwsys_ios::cout << "Problem parsing /proc/meminfo" << kwsys_ios::endl;
      fclose(fd);
      return false;
      }
    }
  fclose( fd );

  return true;
#else
  return false;
#endif
}